

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::peer_connection::on_connection_complete(peer_connection *this,error_code *e)

{
  undefined1 *puVar1;
  socket_type *this_00;
  long lVar2;
  session_interface *psVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  byte bVar6;
  int iVar7;
  uint v;
  time_point tVar8;
  string *psVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  endpoint *ep;
  _List_node_base *p_Var10;
  bool bVar11;
  error_code ec;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_48;
  shared_ptr<libtorrent::aux::torrent> t;
  
  ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>,
             &(this->super_peer_connection_hot_members).m_torrent);
  bVar6 = (this->super_peer_connection_hot_members).field_0x28;
  if ((bVar6 & 2) != 0) {
    counters::inc_stats_counter(this->m_counters,0xe5,-1);
    if (t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      torrent::dec_num_connecting
                (t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 this->m_peer_info);
    }
    bVar6 = (this->super_peer_connection_hot_members).field_0x28 & 0xfd;
    (this->super_peer_connection_hot_members).field_0x28 = bVar6;
  }
  if ((bVar6 & 1) != 0) goto LAB_0022b843;
  if (e->failed_ == true) {
    connect_failed(this,e);
    goto LAB_0022b843;
  }
  this->field_0x885 = this->field_0x885 | 0x80;
  counters::inc_stats_counter(this->m_counters,0xe6,1);
  if (((this->super_peer_connection_hot_members).field_0x28 & 1) != 0) goto LAB_0022b843;
  lVar2 = (this->m_connect).__d.__r;
  tVar8 = time_now();
  (this->m_last_receive).m_time_diff.__r = (rep_conflict)(((long)tVar8.__d.__r - lVar2) / 1000000);
  ec.val_ = 0;
  ec.failed_ = false;
  ec.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  this_00 = &this->m_socket;
  polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
  ::local_endpoint((endpoint_type *)local_58,this_00,&ec);
  *(ulong *)((long)&(this->m_local).impl_.data_ + 0xc) =
       CONCAT44(aStack_48._M_allocated_capacity._0_4_,local_58._12_4_);
  *(ulong *)((long)&(this->m_local).impl_.data_ + 0x14) =
       CONCAT44(aStack_48._8_4_,aStack_48._M_allocated_capacity._4_4_);
  *(ulong *)&(this->m_local).impl_.data_ = CONCAT44(local_58._4_4_,local_58._0_4_);
  *(ulong *)((long)&(this->m_local).impl_.data_ + 8) = CONCAT44(local_58._12_4_,local_58._8_4_);
  bVar6 = 4;
  if (ec.failed_ == false) {
    psVar9 = session_settings::get_str_abi_cxx11_
                       ((this->super_peer_connection_hot_members).m_settings,4);
    if (psVar9->_M_string_length != 0) {
      bVar11 = (this->m_local).impl_.data_.base.sa_family != 2;
      if (bVar11) {
        uVar4 = *(undefined8 *)((long)&(this->m_local).impl_.data_ + 8);
        uVar5 = *(undefined8 *)((long)&(this->m_local).impl_.data_ + 0x10);
        local_58._8_4_ = (undefined4)uVar4;
        local_58._12_4_ = (undefined4)((ulong)uVar4 >> 0x20);
        aStack_48._M_allocated_capacity._0_4_ = (undefined4)uVar5;
        aStack_48._M_allocated_capacity._4_4_ = (undefined4)((ulong)uVar5 >> 0x20);
        aStack_48._8_4_ = (this->m_local).impl_.data_.v6.sin6_scope_id;
        local_58._4_4_ = 0;
      }
      else {
        local_58._4_4_ = (this->m_local).impl_.data_.v4.sin_addr.s_addr;
        local_58._8_4_ = 0;
        local_58._12_4_ = 0;
        aStack_48._M_allocated_capacity._0_4_ = 0;
        aStack_48._M_allocated_capacity._4_4_ = 0;
        aStack_48._8_4_ = 0;
      }
      aStack_48._12_4_ = 0;
      local_58._0_4_ = ZEXT14(bVar11);
      psVar3 = (this->super_peer_connection_hot_members).m_ses;
      bVar11 = is_utp(this_00);
      iVar7 = (*(psVar3->super_session_logger)._vptr_session_logger[0x26])
                        (psVar3,local_58,(ulong)bVar11,&ec);
      if ((char)iVar7 == '\0') {
        bVar6 = 0x12;
        if (ec.failed_ == false) {
          local_58._0_4_ = 0x13;
          bVar11 = boost::system::detail::failed_impl
                             (0x13,&boost::system::detail::cat_holder<void>::
                                    generic_category_instance.super_error_category);
          local_58[4] = bVar11;
          local_58._8_4_ = 0x4c7c00;
          local_58._12_4_ = 0;
          (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(this,local_58,0x10,0);
          goto LAB_0022b843;
        }
        goto LAB_0022b82e;
      }
    }
    bVar11 = is_utp(this_00);
    if ((bVar11) && (this->m_peer_info != (torrent_peer *)0x0)) {
      puVar1 = &this->m_peer_info->field_0x1e;
      *puVar1 = *puVar1 | 0x20;
      puVar1 = &this->m_peer_info->field_0x1b;
      *(uint *)puVar1 = *(uint *)puVar1 & 0xefffffff;
    }
    received_synack(this,(this->m_remote).impl_.data_.base.sa_family != 2);
    iVar7 = (*(((this->super_peer_connection_hot_members).m_ses)->super_session_logger).
              _vptr_session_logger[5])();
    if ((short)*(undefined4 *)(CONCAT44(extraout_var,iVar7) + 0x68) < 0) {
      print_endpoint_abi_cxx11_((string *)local_58,(aux *)&this->m_remote,ep);
      peer_log(this,outgoing,"COMPLETED","ep: %s",CONCAT44(local_58._4_4_,local_58._0_4_));
      ::std::__cxx11::string::~string((string *)local_58);
    }
    peer_log(this,info,"SET_NON_BLOCKING");
    polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
    ::non_blocking(this_00,true,&ec);
    bVar6 = 2;
    if (ec.failed_ != true) {
      polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
      ::local_endpoint((endpoint_type *)local_58,this_00,&ec);
      bVar11 = boost::asio::ip::detail::operator==(&(this->m_remote).impl_,(endpoint *)local_58);
      if (bVar11) {
        boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                  ((error_code *)local_58,self_connection,(type *)0x0);
        (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])
                  (this,(error_code *)local_58,1);
      }
      else {
        iVar7 = session_settings::get_int
                          ((this->super_peer_connection_hot_members).m_settings,0x4028);
        if (iVar7 != 0) {
          v = session_settings::get_int((this->super_peer_connection_hot_members).m_settings,0x4028)
          ;
          set_traffic_class<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>,libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>>
                    (this_00,v,&ec);
          if (ec.failed_ == true) {
            iVar7 = (*(((this->super_peer_connection_hot_members).m_ses)->super_session_logger).
                      _vptr_session_logger[5])();
            if ((short)*(undefined4 *)(CONCAT44(extraout_var_00,iVar7) + 0x68) < 0) {
              (*(ec.cat_)->_vptr_error_category[4])(local_58,ec.cat_,(ulong)(uint)ec.val_);
              peer_log(this,outgoing,"SET_DSCP","value: %d e: %s",(ulong)v,
                       CONCAT44(local_58._4_4_,local_58._0_4_));
              ::std::__cxx11::string::~string((string *)local_58);
            }
          }
        }
        p_Var10 = (_List_node_base *)&this->m_extensions;
        while (p_Var10 = (((_List_base<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
                            *)&p_Var10->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
              p_Var10 != (_List_node_base *)&this->m_extensions) {
          (**(code **)(*(long *)p_Var10[1]._M_next + 0x28))();
        }
        (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x2e])(this);
        if ((*(ushort *)&this->field_0x885 >> 0xd & 1) != 0) {
          *(ushort *)&this->field_0x885 = *(ushort *)&this->field_0x885 & 0xdfff;
          send_block_requests_impl(this);
        }
        setup_receive(this);
        setup_send(this);
      }
      goto LAB_0022b843;
    }
  }
LAB_0022b82e:
  (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(this,&ec,(ulong)bVar6,0);
LAB_0022b843:
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return;
}

Assistant:

void peer_connection::on_connection_complete(error_code const& e)
	{
		TORRENT_ASSERT(is_single_thread());
		COMPLETE_ASYNC("peer_connection::on_connection_complete");

		INVARIANT_CHECK;

		// if t is nullptr, we better not be connecting, since
		// we can't decrement the connecting counter
		auto t = m_torrent.lock();
		TORRENT_ASSERT(t || !m_connecting);
		if (m_connecting)
		{
			m_counters.inc_stats_counter(counters::num_peers_half_open, -1);
			if (t) t->dec_num_connecting(m_peer_info);
			m_connecting = false;
		}

		if (m_disconnecting) return;

		if (e)
		{
			connect_failed(e);
			return;
		}

		TORRENT_ASSERT(!m_connected);
		m_connected = true;
		m_counters.inc_stats_counter(counters::num_peers_connected);

		if (m_disconnecting) return;
		m_last_receive.set(m_connect, aux::time_now());

		error_code ec;
		m_local = m_socket.local_endpoint(ec);
		if (ec)
		{
			disconnect(ec, operation_t::getname);
			return;
		}

		// if there are outgoing interfaces specified, verify this
		// peer is correctly bound to one of them
		if (!m_settings.get_str(settings_pack::outgoing_interfaces).empty())
		{
			if (!m_ses.verify_bound_address(m_local.address()
				, is_utp(m_socket), ec))
			{
				if (ec)
				{
					disconnect(ec, operation_t::get_interface);
					return;
				}
				disconnect(error_code(
					boost::system::errc::no_such_device, generic_category())
					, operation_t::connect);
				return;
			}
		}

		if (is_utp(m_socket) && m_peer_info)
		{
			m_peer_info->confirmed_supports_utp = true;
			m_peer_info->supports_utp = false;
		}

		// this means the connection just succeeded

		received_synack(aux::is_v6(m_remote));

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log(peer_log_alert::outgoing))
		{
			peer_log(peer_log_alert::outgoing, "COMPLETED"
				, "ep: %s", print_endpoint(m_remote).c_str());
		}
#endif

		// set the socket to non-blocking, so that we can
		// read the entire buffer on each read event we get
#ifndef TORRENT_DISABLE_LOGGING
		peer_log(peer_log_alert::info, "SET_NON_BLOCKING");
#endif
		m_socket.non_blocking(true, ec);
		if (ec)
		{
			disconnect(ec, operation_t::iocontrol);
			return;
		}

		if (m_remote == m_socket.local_endpoint(ec)
#if TORRENT_USE_RTC
			// WebRTC connections are independant from the socket (their endpoints are not reliable anyway)
			&& !is_rtc(m_socket)
#endif
		)
		{
			disconnect(errors::self_connection, operation_t::bittorrent, failure);
			return;
		}

		if (m_settings.get_int(settings_pack::peer_dscp) != 0)
		{
			int const value = m_settings.get_int(settings_pack::peer_dscp);
			aux::set_traffic_class(m_socket, value, ec);
#ifndef TORRENT_DISABLE_LOGGING
			if (ec && should_log(peer_log_alert::outgoing))
			{
				peer_log(peer_log_alert::outgoing, "SET_DSCP", "value: %d e: %s"
					, value, ec.message().c_str());
			}
#endif
		}

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto const& ext : m_extensions)
		{
			ext->on_connected();
		}
#endif

		on_connected();

		if (m_deferred_send_block_requests)
		{
			m_deferred_send_block_requests = false;
			send_block_requests_impl();
		}

		setup_receive();
		setup_send();
	}